

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  Scene *pSVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  long lVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [32];
  int iVar18;
  AABBNodeMB4D *node1;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong *puVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  undefined4 uVar38;
  float *vertices;
  ulong uVar39;
  bool bVar40;
  bool bVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  float fVar58;
  float fVar61;
  float fVar62;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  uint uVar77;
  uint uVar79;
  uint uVar80;
  uint uVar81;
  undefined1 auVar78 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  ulong *local_1658;
  ulong local_1610;
  RTCFilterFunctionNArguments local_15b0;
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined1 local_1480 [16];
  undefined1 local_1470 [16];
  undefined1 local_1460 [16];
  undefined1 local_1450 [16];
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 local_1430;
  undefined8 uStack_1428;
  undefined1 local_1420 [16];
  undefined1 local_1410 [16];
  undefined1 local_1400 [16];
  undefined1 local_13f0 [16];
  undefined1 local_13d0 [16];
  float local_13c0 [4];
  undefined1 local_13b0 [16];
  float local_13a0 [4];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [32];
  float local_1340;
  float fStack_133c;
  float fStack_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float fStack_1328;
  float fStack_1324;
  RTCHitN local_1320 [32];
  undefined4 local_1300;
  undefined4 uStack_12fc;
  undefined4 uStack_12f8;
  undefined4 uStack_12f4;
  undefined4 uStack_12f0;
  undefined4 uStack_12ec;
  undefined4 uStack_12e8;
  undefined4 uStack_12e4;
  undefined4 local_12e0;
  undefined4 uStack_12dc;
  undefined4 uStack_12d8;
  undefined4 uStack_12d4;
  undefined4 uStack_12d0;
  undefined4 uStack_12cc;
  undefined4 uStack_12c8;
  undefined4 uStack_12c4;
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  uint local_1260;
  uint uStack_125c;
  uint uStack_1258;
  uint uStack_1254;
  uint uStack_1250;
  uint uStack_124c;
  uint uStack_1248;
  uint uStack_1244;
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  uint uStack_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  fVar58 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_14c0._4_4_ = fVar58;
  local_14c0._0_4_ = fVar58;
  local_14c0._8_4_ = fVar58;
  local_14c0._12_4_ = fVar58;
  local_14c0._16_4_ = fVar58;
  local_14c0._20_4_ = fVar58;
  local_14c0._24_4_ = fVar58;
  local_14c0._28_4_ = fVar58;
  auVar68 = ZEXT3264(local_14c0);
  fVar61 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_14e0._4_4_ = fVar61;
  local_14e0._0_4_ = fVar61;
  local_14e0._8_4_ = fVar61;
  local_14e0._12_4_ = fVar61;
  local_14e0._16_4_ = fVar61;
  local_14e0._20_4_ = fVar61;
  local_14e0._24_4_ = fVar61;
  local_14e0._28_4_ = fVar61;
  auVar69 = ZEXT3264(local_14e0);
  fVar62 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1500._4_4_ = fVar62;
  local_1500._0_4_ = fVar62;
  local_1500._8_4_ = fVar62;
  local_1500._12_4_ = fVar62;
  local_1500._16_4_ = fVar62;
  local_1500._20_4_ = fVar62;
  local_1500._24_4_ = fVar62;
  local_1500._28_4_ = fVar62;
  auVar73 = ZEXT3264(local_1500);
  fVar58 = fVar58 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar61 = fVar61 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar62 = fVar62 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_1520._0_8_ = CONCAT44(fVar58,fVar58) ^ 0x8000000080000000;
  local_1520._8_4_ = -fVar58;
  local_1520._12_4_ = -fVar58;
  local_1520._16_4_ = -fVar58;
  local_1520._20_4_ = -fVar58;
  local_1520._24_4_ = -fVar58;
  local_1520._28_4_ = -fVar58;
  auVar76 = ZEXT3264(local_1520);
  local_1540._0_8_ = CONCAT44(fVar61,fVar61) ^ 0x8000000080000000;
  local_1540._8_4_ = -fVar61;
  local_1540._12_4_ = -fVar61;
  local_1540._16_4_ = -fVar61;
  local_1540._20_4_ = -fVar61;
  local_1540._24_4_ = -fVar61;
  local_1540._28_4_ = -fVar61;
  auVar78 = ZEXT3264(local_1540);
  iVar18 = (tray->tnear).field_0.i[k];
  local_1560._4_4_ = iVar18;
  local_1560._0_4_ = iVar18;
  local_1560._8_4_ = iVar18;
  local_1560._12_4_ = iVar18;
  local_1560._16_4_ = iVar18;
  local_1560._20_4_ = iVar18;
  local_1560._24_4_ = iVar18;
  local_1560._28_4_ = iVar18;
  auVar84 = ZEXT3264(local_1560);
  iVar18 = (tray->tfar).field_0.i[k];
  local_1580._4_4_ = iVar18;
  local_1580._0_4_ = iVar18;
  local_1580._8_4_ = iVar18;
  local_1580._12_4_ = iVar18;
  local_1580._16_4_ = iVar18;
  local_1580._20_4_ = iVar18;
  local_1580._24_4_ = iVar18;
  local_1580._28_4_ = iVar18;
  auVar86 = ZEXT3264(local_1580);
  local_1340 = -fVar62;
  fStack_133c = -fVar62;
  fStack_1338 = -fVar62;
  fStack_1334 = -fVar62;
  fStack_1330 = -fVar62;
  fStack_132c = -fVar62;
  fStack_1328 = -fVar62;
  fStack_1324 = -fVar62;
  iVar18 = 1 << ((uint)k & 0x1f);
  auVar50._4_4_ = iVar18;
  auVar50._0_4_ = iVar18;
  auVar50._8_4_ = iVar18;
  auVar50._12_4_ = iVar18;
  auVar50._16_4_ = iVar18;
  auVar50._20_4_ = iVar18;
  auVar50._24_4_ = iVar18;
  auVar50._28_4_ = iVar18;
  auVar7 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar50 = vpand_avx2(auVar50,auVar7);
  local_1360 = vpcmpeqd_avx2(auVar50,auVar7);
  local_1658 = local_11f8;
  do {
    puVar22 = local_1658;
    if (puVar22 == &local_1200) break;
    local_1658 = puVar22 + -1;
    uVar36 = puVar22[-1];
    do {
      if ((uVar36 & 8) == 0) {
        uVar38 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar51._4_4_ = uVar38;
        auVar51._0_4_ = uVar38;
        auVar51._8_4_ = uVar38;
        auVar51._12_4_ = uVar38;
        auVar51._16_4_ = uVar38;
        auVar51._20_4_ = uVar38;
        auVar51._24_4_ = uVar38;
        auVar51._28_4_ = uVar38;
        uVar19 = uVar36 & 0xfffffffffffffff0;
        auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + uVar24),auVar51,
                                  *(undefined1 (*) [32])(uVar19 + 0x40 + uVar24));
        auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + uVar27),auVar51,
                                  *(undefined1 (*) [32])(uVar19 + 0x40 + uVar27));
        auVar42 = vfmadd213ps_fma(ZEXT1632(auVar42),auVar68._0_32_,auVar76._0_32_);
        auVar47 = vfmadd213ps_fma(ZEXT1632(auVar47),auVar69._0_32_,auVar78._0_32_);
        auVar50 = vpmaxsd_avx2(ZEXT1632(auVar42),ZEXT1632(auVar47));
        auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + uVar29),auVar51,
                                  *(undefined1 (*) [32])(uVar19 + 0x40 + uVar29));
        auVar6._4_4_ = fStack_133c;
        auVar6._0_4_ = local_1340;
        auVar6._8_4_ = fStack_1338;
        auVar6._12_4_ = fStack_1334;
        auVar6._16_4_ = fStack_1330;
        auVar6._20_4_ = fStack_132c;
        auVar6._24_4_ = fStack_1328;
        auVar6._28_4_ = fStack_1324;
        auVar42 = vfmadd213ps_fma(ZEXT1632(auVar42),auVar73._0_32_,auVar6);
        auVar7 = vpmaxsd_avx2(ZEXT1632(auVar42),auVar84._0_32_);
        auVar50 = vpmaxsd_avx2(auVar50,auVar7);
        auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + (uVar24 ^ 0x20)),auVar51,
                                  *(undefined1 (*) [32])(uVar19 + 0x40 + (uVar24 ^ 0x20)));
        auVar42 = vfmadd213ps_fma(ZEXT1632(auVar42),auVar68._0_32_,auVar76._0_32_);
        auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + (uVar27 ^ 0x20)),auVar51,
                                  *(undefined1 (*) [32])(uVar19 + 0x40 + (uVar27 ^ 0x20)));
        auVar47 = vfmadd213ps_fma(ZEXT1632(auVar47),auVar69._0_32_,auVar78._0_32_);
        auVar43 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + (uVar29 ^ 0x20)),auVar51,
                                  *(undefined1 (*) [32])(uVar19 + 0x40 + (uVar29 ^ 0x20)));
        auVar7 = vpminsd_avx2(ZEXT1632(auVar42),ZEXT1632(auVar47));
        auVar42 = vfmadd213ps_fma(ZEXT1632(auVar43),auVar73._0_32_,auVar6);
        auVar6 = vpminsd_avx2(ZEXT1632(auVar42),auVar86._0_32_);
        auVar7 = vpminsd_avx2(auVar7,auVar6);
        auVar50 = vcmpps_avx(auVar50,auVar7,2);
        if (((uint)uVar36 & 7) == 6) {
          auVar7 = vcmpps_avx(*(undefined1 (*) [32])(uVar19 + 0x1c0),auVar51,2);
          auVar6 = vcmpps_avx(auVar51,*(undefined1 (*) [32])(uVar19 + 0x1e0),1);
          auVar7 = vandps_avx(auVar7,auVar6);
          auVar50 = vandps_avx(auVar7,auVar50);
          auVar42 = vpackssdw_avx(auVar50._0_16_,auVar50._16_16_);
        }
        else {
          auVar42 = vpackssdw_avx(auVar50._0_16_,auVar50._16_16_);
        }
        auVar42 = vpsllw_avx(auVar42,0xf);
        auVar42 = vpacksswb_avx(auVar42,auVar42);
        local_1610 = (ulong)(byte)(SUB161(auVar42 >> 7,0) & 1 | (SUB161(auVar42 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar42 >> 0x3f,0) << 7);
      }
      if ((uVar36 & 8) == 0) {
        if (local_1610 == 0) {
          uVar77 = 4;
        }
        else {
          uVar19 = uVar36 & 0xfffffffffffffff0;
          lVar8 = 0;
          for (uVar36 = local_1610; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
            lVar8 = lVar8 + 1;
          }
          uVar77 = 0;
          uVar36 = *(ulong *)(uVar19 + lVar8 * 8);
          for (uVar20 = local_1610 - 1 & local_1610; uVar20 != 0; uVar20 = uVar20 - 1 & uVar20) {
            *local_1658 = uVar36;
            local_1658 = local_1658 + 1;
            lVar8 = 0;
            for (uVar36 = uVar20; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
              lVar8 = lVar8 + 1;
            }
            uVar36 = *(ulong *)(uVar19 + lVar8 * 8);
          }
        }
      }
      else {
        uVar77 = 6;
      }
    } while (uVar77 == 0);
    if (uVar77 == 6) {
      uVar19 = (ulong)((uint)uVar36 & 0xf);
      uVar77 = 0;
      uVar20 = uVar19 - 8;
      bVar40 = uVar19 != 8;
      if (bVar40) {
        uVar36 = uVar36 & 0xfffffffffffffff0;
        uVar19 = 0;
        do {
          lVar21 = uVar19 * 0x50;
          pSVar3 = context->scene;
          pGVar4 = (pSVar3->geometries).items[*(uint *)(uVar36 + 0x30 + lVar21)].ptr;
          fVar58 = (pGVar4->time_range).lower;
          fVar58 = pGVar4->fnumTimeSegments *
                   ((*(float *)(ray + k * 4 + 0xe0) - fVar58) /
                   ((pGVar4->time_range).upper - fVar58));
          auVar42 = vroundss_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58),9);
          auVar42 = vminss_avx(auVar42,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
          auVar55 = vmaxss_avx(ZEXT816(0),auVar42);
          lVar25 = (long)(int)auVar55._0_4_ * 0x38;
          uVar26 = (ulong)*(uint *)(uVar36 + 4 + lVar21);
          lVar8 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar25);
          lVar25 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x38 + lVar25);
          auVar42 = *(undefined1 (*) [16])(lVar8 + (ulong)*(uint *)(uVar36 + lVar21) * 4);
          uVar39 = (ulong)*(uint *)(uVar36 + 0x10 + lVar21);
          auVar47 = *(undefined1 (*) [16])(lVar8 + uVar39 * 4);
          uVar23 = (ulong)*(uint *)(uVar36 + 0x20 + lVar21);
          auVar54 = *(undefined1 (*) [16])(lVar8 + uVar23 * 4);
          auVar43 = *(undefined1 (*) [16])(lVar8 + uVar26 * 4);
          uVar28 = (ulong)*(uint *)(uVar36 + 0x14 + lVar21);
          auVar60 = *(undefined1 (*) [16])(lVar8 + uVar28 * 4);
          uVar30 = (ulong)*(uint *)(uVar36 + 0x24 + lVar21);
          auVar64 = *(undefined1 (*) [16])(lVar8 + uVar30 * 4);
          uVar35 = (ulong)*(uint *)(uVar36 + 8 + lVar21);
          auVar52 = *(undefined1 (*) [16])(lVar8 + uVar35 * 4);
          uVar33 = (ulong)*(uint *)(uVar36 + 0x18 + lVar21);
          auVar71 = *(undefined1 (*) [16])(lVar8 + uVar33 * 4);
          uVar31 = (ulong)*(uint *)(uVar36 + 0x28 + lVar21);
          auVar53 = *(undefined1 (*) [16])(lVar8 + uVar31 * 4);
          uVar37 = (ulong)*(uint *)(uVar36 + 0xc + lVar21);
          auVar49 = *(undefined1 (*) [16])(lVar8 + uVar37 * 4);
          uVar34 = (ulong)*(uint *)(uVar36 + 0x1c + lVar21);
          auVar44 = *(undefined1 (*) [16])(lVar8 + uVar34 * 4);
          uVar32 = (ulong)*(uint *)(uVar36 + 0x2c + lVar21);
          auVar45 = *(undefined1 (*) [16])(lVar8 + uVar32 * 4);
          auVar46 = *(undefined1 (*) [16])(lVar25 + (ulong)*(uint *)(uVar36 + lVar21) * 4);
          auVar67 = *(undefined1 (*) [16])(lVar25 + uVar39 * 4);
          fVar58 = fVar58 - auVar55._0_4_;
          auVar55 = vunpcklps_avx(auVar42,auVar52);
          auVar52 = vunpckhps_avx(auVar42,auVar52);
          auVar59 = vunpcklps_avx(auVar43,auVar49);
          auVar43 = vunpckhps_avx(auVar43,auVar49);
          auVar42 = *(undefined1 (*) [16])(lVar25 + uVar26 * 4);
          local_1470 = vunpcklps_avx(auVar52,auVar43);
          auVar49 = vunpcklps_avx(auVar55,auVar59);
          auVar52 = vunpckhps_avx(auVar55,auVar59);
          auVar55 = vunpcklps_avx(auVar47,auVar71);
          auVar43 = vunpckhps_avx(auVar47,auVar71);
          auVar71 = vunpcklps_avx(auVar60,auVar44);
          auVar60 = vunpckhps_avx(auVar60,auVar44);
          auVar47 = *(undefined1 (*) [16])(lVar25 + uVar35 * 4);
          local_1460 = vunpcklps_avx(auVar43,auVar60);
          auVar44 = vunpcklps_avx(auVar55,auVar71);
          local_1480 = vunpckhps_avx(auVar55,auVar71);
          auVar55 = vunpcklps_avx(auVar54,auVar53);
          auVar60 = vunpckhps_avx(auVar54,auVar53);
          auVar53 = vunpcklps_avx(auVar64,auVar45);
          auVar71 = vunpckhps_avx(auVar64,auVar45);
          auVar43 = *(undefined1 (*) [16])(lVar25 + uVar37 * 4);
          auVar45 = vunpcklps_avx(auVar60,auVar71);
          auVar59 = vunpcklps_avx(auVar55,auVar53);
          local_1450 = vunpckhps_avx(auVar55,auVar53);
          auVar60 = vunpcklps_avx(auVar46,auVar47);
          auVar47 = vunpckhps_avx(auVar46,auVar47);
          auVar71 = vunpcklps_avx(auVar42,auVar43);
          auVar43 = vunpckhps_avx(auVar42,auVar43);
          auVar42 = *(undefined1 (*) [16])(lVar25 + uVar33 * 4);
          auVar53 = vunpcklps_avx(auVar47,auVar43);
          auVar46 = vunpcklps_avx(auVar60,auVar71);
          auVar43 = vunpckhps_avx(auVar60,auVar71);
          auVar71 = vunpcklps_avx(auVar67,auVar42);
          auVar60 = vunpckhps_avx(auVar67,auVar42);
          auVar42 = *(undefined1 (*) [16])(lVar25 + uVar28 * 4);
          auVar47 = *(undefined1 (*) [16])(lVar25 + uVar34 * 4);
          auVar67 = vunpcklps_avx(auVar42,auVar47);
          auVar42 = vunpckhps_avx(auVar42,auVar47);
          auVar55 = vunpcklps_avx(auVar60,auVar42);
          auVar54 = vunpcklps_avx(auVar71,auVar67);
          auVar60 = vunpckhps_avx(auVar71,auVar67);
          auVar42 = *(undefined1 (*) [16])(lVar25 + uVar23 * 4);
          auVar47 = *(undefined1 (*) [16])(lVar25 + uVar31 * 4);
          auVar67 = vunpcklps_avx(auVar42,auVar47);
          auVar71 = vunpckhps_avx(auVar42,auVar47);
          auVar42 = *(undefined1 (*) [16])(lVar25 + uVar30 * 4);
          auVar47 = *(undefined1 (*) [16])(lVar25 + uVar32 * 4);
          auVar64 = vunpcklps_avx(auVar42,auVar47);
          auVar42 = vunpckhps_avx(auVar42,auVar47);
          auVar47 = vunpcklps_avx(auVar71,auVar42);
          auVar71 = vunpcklps_avx(auVar67,auVar64);
          auVar42 = vunpckhps_avx(auVar67,auVar64);
          fVar61 = 1.0 - fVar58;
          auVar87._4_4_ = fVar61;
          auVar87._0_4_ = fVar61;
          auVar87._8_4_ = fVar61;
          auVar87._12_4_ = fVar61;
          auVar67._0_4_ = fVar58 * auVar46._0_4_;
          auVar67._4_4_ = fVar58 * auVar46._4_4_;
          auVar67._8_4_ = fVar58 * auVar46._8_4_;
          auVar67._12_4_ = fVar58 * auVar46._12_4_;
          auVar49 = vfmadd231ps_fma(auVar67,auVar87,auVar49);
          auVar70._0_4_ = fVar58 * auVar43._0_4_;
          auVar70._4_4_ = fVar58 * auVar43._4_4_;
          auVar70._8_4_ = fVar58 * auVar43._8_4_;
          auVar70._12_4_ = fVar58 * auVar43._12_4_;
          auVar46 = vfmadd231ps_fma(auVar70,auVar87,auVar52);
          auVar74._0_4_ = fVar58 * auVar53._0_4_;
          auVar74._4_4_ = fVar58 * auVar53._4_4_;
          auVar74._8_4_ = fVar58 * auVar53._8_4_;
          auVar74._12_4_ = fVar58 * auVar53._12_4_;
          auVar67 = vfmadd231ps_fma(auVar74,auVar87,local_1470);
          auVar43._0_4_ = fVar58 * auVar54._0_4_;
          auVar43._4_4_ = fVar58 * auVar54._4_4_;
          auVar43._8_4_ = fVar58 * auVar54._8_4_;
          auVar43._12_4_ = fVar58 * auVar54._12_4_;
          auVar43 = vfmadd231ps_fma(auVar43,auVar87,auVar44);
          auVar52._0_4_ = fVar58 * auVar60._0_4_;
          auVar52._4_4_ = fVar58 * auVar60._4_4_;
          auVar52._8_4_ = fVar58 * auVar60._8_4_;
          auVar52._12_4_ = fVar58 * auVar60._12_4_;
          auVar60 = vfmadd231ps_fma(auVar52,auVar87,local_1480);
          auVar54._0_4_ = fVar58 * auVar55._0_4_;
          auVar54._4_4_ = fVar58 * auVar55._4_4_;
          auVar54._8_4_ = fVar58 * auVar55._8_4_;
          auVar54._12_4_ = fVar58 * auVar55._12_4_;
          auVar52 = vfmadd231ps_fma(auVar54,auVar87,local_1460);
          puVar1 = (undefined8 *)(uVar36 + 0x30 + lVar21);
          local_1430 = *puVar1;
          uStack_1428 = puVar1[1];
          puVar1 = (undefined8 *)(uVar36 + 0x40 + lVar21);
          auVar64._0_4_ = fVar58 * auVar71._0_4_;
          auVar64._4_4_ = fVar58 * auVar71._4_4_;
          auVar64._8_4_ = fVar58 * auVar71._8_4_;
          auVar64._12_4_ = fVar58 * auVar71._12_4_;
          auVar82._0_4_ = fVar58 * auVar42._0_4_;
          auVar82._4_4_ = fVar58 * auVar42._4_4_;
          auVar82._8_4_ = fVar58 * auVar42._8_4_;
          auVar82._12_4_ = fVar58 * auVar42._12_4_;
          auVar89._0_4_ = fVar58 * auVar47._0_4_;
          auVar89._4_4_ = fVar58 * auVar47._4_4_;
          auVar89._8_4_ = fVar58 * auVar47._8_4_;
          auVar89._12_4_ = fVar58 * auVar47._12_4_;
          auVar71 = vfmadd231ps_fma(auVar64,auVar87,auVar59);
          auVar53 = vfmadd231ps_fma(auVar82,auVar87,local_1450);
          auVar44 = vfmadd231ps_fma(auVar89,auVar87,auVar45);
          local_1440 = *puVar1;
          uStack_1438 = puVar1[1];
          auVar47 = vsubps_avx(auVar49,auVar43);
          auVar42 = vsubps_avx(auVar46,auVar60);
          auVar43 = vsubps_avx(auVar67,auVar52);
          auVar60 = vsubps_avx(auVar71,auVar49);
          auVar52 = vsubps_avx(auVar53,auVar46);
          auVar71 = vsubps_avx(auVar44,auVar67);
          auVar53._0_4_ = auVar42._0_4_ * auVar71._0_4_;
          auVar53._4_4_ = auVar42._4_4_ * auVar71._4_4_;
          auVar53._8_4_ = auVar42._8_4_ * auVar71._8_4_;
          auVar53._12_4_ = auVar42._12_4_ * auVar71._12_4_;
          local_1390 = vfmsub231ps_fma(auVar53,auVar52,auVar43);
          auVar59._0_4_ = auVar43._0_4_ * auVar60._0_4_;
          auVar59._4_4_ = auVar43._4_4_ * auVar60._4_4_;
          auVar59._8_4_ = auVar43._8_4_ * auVar60._8_4_;
          auVar59._12_4_ = auVar43._12_4_ * auVar60._12_4_;
          local_1380 = vfmsub231ps_fma(auVar59,auVar71,auVar47);
          uVar38 = *(undefined4 *)(ray + k * 4);
          auVar55._4_4_ = uVar38;
          auVar55._0_4_ = uVar38;
          auVar55._8_4_ = uVar38;
          auVar55._12_4_ = uVar38;
          uVar38 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar65._4_4_ = uVar38;
          auVar65._0_4_ = uVar38;
          auVar65._8_4_ = uVar38;
          auVar65._12_4_ = uVar38;
          uVar38 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar44._4_4_ = uVar38;
          auVar44._0_4_ = uVar38;
          auVar44._8_4_ = uVar38;
          auVar44._12_4_ = uVar38;
          fVar58 = *(float *)(ray + k * 4 + 0x80);
          auVar88._4_4_ = fVar58;
          auVar88._0_4_ = fVar58;
          auVar88._8_4_ = fVar58;
          auVar88._12_4_ = fVar58;
          auVar53 = vsubps_avx(auVar49,auVar55);
          fVar61 = *(float *)(ray + k * 4 + 0xa0);
          auVar90._4_4_ = fVar61;
          auVar90._0_4_ = fVar61;
          auVar90._8_4_ = fVar61;
          auVar90._12_4_ = fVar61;
          auVar49 = vsubps_avx(auVar46,auVar65);
          fVar62 = *(float *)(ray + k * 4 + 0xc0);
          auVar91._4_4_ = fVar62;
          auVar91._0_4_ = fVar62;
          auVar91._8_4_ = fVar62;
          auVar91._12_4_ = fVar62;
          auVar44 = vsubps_avx(auVar67,auVar44);
          auVar45._0_4_ = fVar58 * auVar49._0_4_;
          auVar45._4_4_ = fVar58 * auVar49._4_4_;
          auVar45._8_4_ = fVar58 * auVar49._8_4_;
          auVar45._12_4_ = fVar58 * auVar49._12_4_;
          auVar45 = vfmsub231ps_fma(auVar45,auVar53,auVar90);
          auVar75._0_4_ = auVar71._0_4_ * auVar45._0_4_;
          auVar75._4_4_ = auVar71._4_4_ * auVar45._4_4_;
          auVar75._8_4_ = auVar71._8_4_ * auVar45._8_4_;
          auVar75._12_4_ = auVar71._12_4_ * auVar45._12_4_;
          auVar46._0_4_ = auVar43._0_4_ * auVar45._0_4_;
          auVar46._4_4_ = auVar43._4_4_ * auVar45._4_4_;
          auVar46._8_4_ = auVar43._8_4_ * auVar45._8_4_;
          auVar46._12_4_ = auVar43._12_4_ * auVar45._12_4_;
          auVar71._0_4_ = fVar62 * auVar53._0_4_;
          auVar71._4_4_ = fVar62 * auVar53._4_4_;
          auVar71._8_4_ = fVar62 * auVar53._8_4_;
          auVar71._12_4_ = fVar62 * auVar53._12_4_;
          auVar71 = vfmsub231ps_fma(auVar71,auVar44,auVar88);
          auVar43 = vfmadd231ps_fma(auVar75,auVar71,auVar52);
          auVar71 = vfmadd231ps_fma(auVar46,auVar42,auVar71);
          auVar72._0_4_ = auVar52._0_4_ * auVar47._0_4_;
          auVar72._4_4_ = auVar52._4_4_ * auVar47._4_4_;
          auVar72._8_4_ = auVar52._8_4_ * auVar47._8_4_;
          auVar72._12_4_ = auVar52._12_4_ * auVar47._12_4_;
          local_1370 = vfmsub231ps_fma(auVar72,auVar60,auVar42);
          auVar83._0_4_ = fVar61 * auVar44._0_4_;
          auVar83._4_4_ = fVar61 * auVar44._4_4_;
          auVar83._8_4_ = fVar61 * auVar44._8_4_;
          auVar83._12_4_ = fVar61 * auVar44._12_4_;
          auVar45 = vfmsub231ps_fma(auVar83,auVar49,auVar91);
          auVar85._0_4_ = fVar62 * local_1370._0_4_;
          auVar85._4_4_ = fVar62 * local_1370._4_4_;
          auVar85._8_4_ = fVar62 * local_1370._8_4_;
          auVar85._12_4_ = fVar62 * local_1370._12_4_;
          auVar42 = vfmadd231ps_fma(auVar85,local_1380,auVar90);
          auVar52 = vfmadd231ps_fma(auVar42,local_1390,auVar88);
          auVar42._8_4_ = 0x80000000;
          auVar42._0_8_ = 0x8000000080000000;
          auVar42._12_4_ = 0x80000000;
          auVar43 = vfmadd231ps_fma(auVar43,auVar45,auVar60);
          auVar42 = vandps_avx(auVar52,auVar42);
          uVar77 = auVar42._0_4_;
          local_1420._0_4_ = (float)(uVar77 ^ auVar43._0_4_);
          uVar79 = auVar42._4_4_;
          local_1420._4_4_ = (float)(uVar79 ^ auVar43._4_4_);
          uVar80 = auVar42._8_4_;
          local_1420._8_4_ = (float)(uVar80 ^ auVar43._8_4_);
          uVar81 = auVar42._12_4_;
          local_1420._12_4_ = (float)(uVar81 ^ auVar43._12_4_);
          auVar42 = vfmadd231ps_fma(auVar71,auVar47,auVar45);
          local_1410._0_4_ = (float)(uVar77 ^ auVar42._0_4_);
          local_1410._4_4_ = (float)(uVar79 ^ auVar42._4_4_);
          local_1410._8_4_ = (float)(uVar80 ^ auVar42._8_4_);
          local_1410._12_4_ = (float)(uVar81 ^ auVar42._12_4_);
          auVar43 = ZEXT816(0) << 0x20;
          auVar42 = vcmpps_avx(local_1420,auVar43,5);
          auVar47 = vcmpps_avx(local_1410,auVar43,5);
          auVar42 = vandps_avx(auVar42,auVar47);
          auVar60._8_4_ = 0x7fffffff;
          auVar60._0_8_ = 0x7fffffff7fffffff;
          auVar60._12_4_ = 0x7fffffff;
          local_13f0 = vandps_avx(auVar52,auVar60);
          auVar47 = vcmpps_avx(auVar52,auVar43,4);
          auVar42 = vandps_avx(auVar47,auVar42);
          auVar47._0_4_ = local_1410._0_4_ + local_1420._0_4_;
          auVar47._4_4_ = local_1410._4_4_ + local_1420._4_4_;
          auVar47._8_4_ = local_1410._8_4_ + local_1420._8_4_;
          auVar47._12_4_ = local_1410._12_4_ + local_1420._12_4_;
          auVar47 = vcmpps_avx(auVar47,local_13f0,2);
          auVar43 = auVar47 & auVar42;
          if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar43[0xf] < '\0') {
            auVar42 = vandps_avx(auVar42,auVar47);
            auVar48._0_4_ = local_1370._0_4_ * auVar44._0_4_;
            auVar48._4_4_ = local_1370._4_4_ * auVar44._4_4_;
            auVar48._8_4_ = local_1370._8_4_ * auVar44._8_4_;
            auVar48._12_4_ = local_1370._12_4_ * auVar44._12_4_;
            auVar47 = vfmadd213ps_fma(auVar49,local_1380,auVar48);
            auVar47 = vfmadd213ps_fma(auVar53,local_1390,auVar47);
            local_1400._0_4_ = (float)(uVar77 ^ auVar47._0_4_);
            local_1400._4_4_ = (float)(uVar79 ^ auVar47._4_4_);
            local_1400._8_4_ = (float)(uVar80 ^ auVar47._8_4_);
            local_1400._12_4_ = (float)(uVar81 ^ auVar47._12_4_);
            fVar58 = *(float *)(ray + k * 4 + 0x60);
            auVar49._0_4_ = local_13f0._0_4_ * fVar58;
            auVar49._4_4_ = local_13f0._4_4_ * fVar58;
            auVar49._8_4_ = local_13f0._8_4_ * fVar58;
            auVar49._12_4_ = local_13f0._12_4_ * fVar58;
            auVar47 = vcmpps_avx(auVar49,local_1400,1);
            fVar58 = *(float *)(ray + k * 4 + 0x100);
            auVar66._0_4_ = local_13f0._0_4_ * fVar58;
            auVar66._4_4_ = local_13f0._4_4_ * fVar58;
            auVar66._8_4_ = local_13f0._8_4_ * fVar58;
            auVar66._12_4_ = local_13f0._12_4_ * fVar58;
            auVar43 = vcmpps_avx(local_1400,auVar66,2);
            auVar47 = vandps_avx(auVar47,auVar43);
            auVar43 = auVar42 & auVar47;
            if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar43[0xf] < '\0') {
              local_13d0 = vandps_avx(auVar42,auVar47);
              auVar42 = vrcpps_avx(local_13f0);
              auVar56._8_4_ = 0x3f800000;
              auVar56._0_8_ = &DAT_3f8000003f800000;
              auVar56._12_4_ = 0x3f800000;
              auVar47 = vfnmadd213ps_fma(local_13f0,auVar42,auVar56);
              auVar42 = vfmadd132ps_fma(auVar47,auVar42,auVar42);
              fVar58 = auVar42._0_4_;
              fVar61 = auVar42._4_4_;
              fVar62 = auVar42._8_4_;
              fVar63 = auVar42._12_4_;
              local_13a0[0] = fVar58 * local_1400._0_4_;
              local_13a0[1] = fVar61 * local_1400._4_4_;
              local_13a0[2] = fVar62 * local_1400._8_4_;
              local_13a0[3] = fVar63 * local_1400._12_4_;
              local_13c0[0] = fVar58 * local_1420._0_4_;
              local_13c0[1] = fVar61 * local_1420._4_4_;
              local_13c0[2] = fVar62 * local_1420._8_4_;
              local_13c0[3] = fVar63 * local_1420._12_4_;
              local_13b0._0_4_ = fVar58 * local_1410._0_4_;
              local_13b0._4_4_ = fVar61 * local_1410._4_4_;
              local_13b0._8_4_ = fVar62 * local_1410._8_4_;
              local_13b0._12_4_ = fVar63 * local_1410._12_4_;
              uVar38 = vmovmskps_avx(local_13d0);
              uVar39 = CONCAT44((int)((ulong)lVar8 >> 0x20),uVar38);
              do {
                uVar26 = 0;
                for (uVar23 = uVar39; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000)
                {
                  uVar26 = uVar26 + 1;
                }
                local_1260 = *(uint *)((long)&local_1430 + uVar26 * 4);
                pGVar4 = (pSVar3->geometries).items[local_1260].ptr;
                if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  uVar39 = uVar39 ^ 1L << (uVar26 & 0x3f);
                  bVar41 = true;
                  auVar68 = ZEXT3264(local_14c0);
                  auVar69 = ZEXT3264(local_14e0);
                  auVar73 = ZEXT3264(local_1500);
                  auVar76 = ZEXT3264(local_1520);
                  auVar78 = ZEXT3264(local_1540);
                  auVar84 = ZEXT3264(local_1560);
                  auVar86 = ZEXT3264(local_1580);
                }
                else {
                  auVar68 = ZEXT3264(local_14c0);
                  auVar69 = ZEXT3264(local_14e0);
                  auVar73 = ZEXT3264(local_1500);
                  auVar76 = ZEXT3264(local_1520);
                  auVar78 = ZEXT3264(local_1540);
                  auVar84 = ZEXT3264(local_1560);
                  auVar86 = ZEXT3264(local_1580);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar41 = false;
                  }
                  else {
                    uVar38 = *(undefined4 *)(ray + k * 4 + 0x100);
                    uVar23 = (ulong)(uint)((int)uVar26 * 4);
                    uVar2 = *(undefined4 *)((long)local_13c0 + uVar23);
                    local_12c0._4_4_ = uVar2;
                    local_12c0._0_4_ = uVar2;
                    local_12c0._8_4_ = uVar2;
                    local_12c0._12_4_ = uVar2;
                    local_12c0._16_4_ = uVar2;
                    local_12c0._20_4_ = uVar2;
                    local_12c0._24_4_ = uVar2;
                    local_12c0._28_4_ = uVar2;
                    uVar2 = *(undefined4 *)(local_13b0 + uVar23);
                    local_12a0._4_4_ = uVar2;
                    local_12a0._0_4_ = uVar2;
                    local_12a0._8_4_ = uVar2;
                    local_12a0._12_4_ = uVar2;
                    local_12a0._16_4_ = uVar2;
                    local_12a0._20_4_ = uVar2;
                    local_12a0._24_4_ = uVar2;
                    local_12a0._28_4_ = uVar2;
                    *(undefined4 *)(ray + k * 4 + 0x100) =
                         *(undefined4 *)((long)local_13a0 + uVar23);
                    local_15b0.context = context->user;
                    uVar2 = *(undefined4 *)((long)&local_1440 + uVar23);
                    local_1280._4_4_ = uVar2;
                    local_1280._0_4_ = uVar2;
                    local_1280._8_4_ = uVar2;
                    local_1280._12_4_ = uVar2;
                    local_1280._16_4_ = uVar2;
                    local_1280._20_4_ = uVar2;
                    local_1280._24_4_ = uVar2;
                    local_1280._28_4_ = uVar2;
                    uVar2 = *(undefined4 *)(local_1390 + uVar23);
                    local_1300 = *(undefined4 *)(local_1380 + uVar23);
                    local_12e0 = *(undefined4 *)(local_1370 + uVar23);
                    local_1320[0] = (RTCHitN)(char)uVar2;
                    local_1320[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1320[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1320[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_1320[4] = (RTCHitN)(char)uVar2;
                    local_1320[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1320[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1320[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_1320[8] = (RTCHitN)(char)uVar2;
                    local_1320[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1320[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1320[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_1320[0xc] = (RTCHitN)(char)uVar2;
                    local_1320[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1320[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1320[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_1320[0x10] = (RTCHitN)(char)uVar2;
                    local_1320[0x11] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1320[0x12] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1320[0x13] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_1320[0x14] = (RTCHitN)(char)uVar2;
                    local_1320[0x15] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1320[0x16] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1320[0x17] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_1320[0x18] = (RTCHitN)(char)uVar2;
                    local_1320[0x19] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1320[0x1a] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1320[0x1b] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    local_1320[0x1c] = (RTCHitN)(char)uVar2;
                    local_1320[0x1d] = (RTCHitN)(char)((uint)uVar2 >> 8);
                    local_1320[0x1e] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                    local_1320[0x1f] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                    uStack_12fc = local_1300;
                    uStack_12f8 = local_1300;
                    uStack_12f4 = local_1300;
                    uStack_12f0 = local_1300;
                    uStack_12ec = local_1300;
                    uStack_12e8 = local_1300;
                    uStack_12e4 = local_1300;
                    uStack_12dc = local_12e0;
                    uStack_12d8 = local_12e0;
                    uStack_12d4 = local_12e0;
                    uStack_12d0 = local_12e0;
                    uStack_12cc = local_12e0;
                    uStack_12c8 = local_12e0;
                    uStack_12c4 = local_12e0;
                    uStack_125c = local_1260;
                    uStack_1258 = local_1260;
                    uStack_1254 = local_1260;
                    uStack_1250 = local_1260;
                    uStack_124c = local_1260;
                    uStack_1248 = local_1260;
                    uStack_1244 = local_1260;
                    vpcmpeqd_avx2(local_12c0,local_12c0);
                    uStack_123c = (local_15b0.context)->instID[0];
                    local_1240 = uStack_123c;
                    uStack_1238 = uStack_123c;
                    uStack_1234 = uStack_123c;
                    uStack_1230 = uStack_123c;
                    uStack_122c = uStack_123c;
                    uStack_1228 = uStack_123c;
                    uStack_1224 = uStack_123c;
                    uStack_121c = (local_15b0.context)->instPrimID[0];
                    local_1220 = uStack_121c;
                    uStack_1218 = uStack_121c;
                    uStack_1214 = uStack_121c;
                    uStack_1210 = uStack_121c;
                    uStack_120c = uStack_121c;
                    uStack_1208 = uStack_121c;
                    uStack_1204 = uStack_121c;
                    local_14a0 = local_1360._0_8_;
                    uStack_1498 = local_1360._8_8_;
                    uStack_1490 = local_1360._16_8_;
                    uStack_1488 = local_1360._24_8_;
                    local_15b0.valid = (int *)&local_14a0;
                    local_15b0.geometryUserPtr = pGVar4->userPtr;
                    local_15b0.hit = local_1320;
                    local_15b0.N = 8;
                    local_15b0.ray = (RTCRayN *)ray;
                    if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar4->occlusionFilterN)(&local_15b0);
                    }
                    auVar7._8_8_ = uStack_1498;
                    auVar7._0_8_ = local_14a0;
                    auVar7._16_8_ = uStack_1490;
                    auVar7._24_8_ = uStack_1488;
                    auVar7 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar7);
                    auVar50 = _DAT_0205a980 & ~auVar7;
                    if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar50 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar50 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar50 >> 0x7f,0) == '\0') &&
                          (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar50 >> 0xbf,0) == '\0') &&
                        (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar50[0x1f]) {
                      auVar7 = auVar7 ^ _DAT_0205a980;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var5)(&local_15b0);
                      }
                      auVar17._8_8_ = uStack_1498;
                      auVar17._0_8_ = local_14a0;
                      auVar17._16_8_ = uStack_1490;
                      auVar17._24_8_ = uStack_1488;
                      auVar50 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar17);
                      auVar7 = auVar50 ^ _DAT_0205a980;
                      auVar57._8_4_ = 0xff800000;
                      auVar57._0_8_ = 0xff800000ff800000;
                      auVar57._12_4_ = 0xff800000;
                      auVar57._16_4_ = 0xff800000;
                      auVar57._20_4_ = 0xff800000;
                      auVar57._24_4_ = 0xff800000;
                      auVar57._28_4_ = 0xff800000;
                      auVar50 = vblendvps_avx(auVar57,*(undefined1 (*) [32])(local_15b0.ray + 0x100)
                                              ,auVar50);
                      *(undefined1 (*) [32])(local_15b0.ray + 0x100) = auVar50;
                    }
                    bVar15 = (auVar7 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar16 = (auVar7 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar14 = (auVar7 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                    bVar13 = SUB321(auVar7 >> 0x7f,0) == '\0';
                    bVar12 = (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                    bVar11 = SUB321(auVar7 >> 0xbf,0) == '\0';
                    bVar10 = (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                    bVar9 = -1 < auVar7[0x1f];
                    bVar41 = ((((((bVar15 && bVar16) && bVar14) && bVar13) && bVar12) && bVar11) &&
                             bVar10) && bVar9;
                    if (((((((bVar15 && bVar16) && bVar14) && bVar13) && bVar12) && bVar11) &&
                        bVar10) && bVar9) {
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar38;
                      uVar39 = uVar39 ^ 1L << (uVar26 & 0x3f);
                    }
                    auVar68 = ZEXT3264(local_14c0);
                    auVar69 = ZEXT3264(local_14e0);
                    auVar73 = ZEXT3264(local_1500);
                    auVar76 = ZEXT3264(local_1520);
                    auVar78 = ZEXT3264(local_1540);
                    auVar84 = ZEXT3264(local_1560);
                    auVar86 = ZEXT3264(local_1580);
                  }
                }
                uVar77 = 0;
                if (!bVar41) {
                  if (bVar40) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                    uVar77 = 1;
                  }
                  goto LAB_006bb160;
                }
              } while (uVar39 != 0);
            }
          }
          uVar77 = 0;
          uVar19 = uVar19 + 1;
          bVar40 = uVar19 < uVar20;
        } while (uVar19 != uVar20);
        auVar68 = ZEXT3264(local_14c0);
        auVar69 = ZEXT3264(local_14e0);
        auVar73 = ZEXT3264(local_1500);
        auVar76 = ZEXT3264(local_1520);
        auVar78 = ZEXT3264(local_1540);
        auVar84 = ZEXT3264(local_1560);
        auVar86 = ZEXT3264(local_1580);
      }
    }
LAB_006bb160:
  } while ((uVar77 & 3) == 0);
  return puVar22 != &local_1200;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }